

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O1

void io::save<double>(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *data,string *file_name)

{
  pointer pvVar1;
  char cVar2;
  pointer pdVar3;
  ulong uVar4;
  ostream *poVar5;
  ulong uVar6;
  uint uVar7;
  ofstream file;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ostream *)&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)(file_name->_M_dataplus)._M_p);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 0x10;
    if ((data->
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (data->
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      uVar6 = 0;
      do {
        pvVar1 = (data->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pdVar3 = pvVar1[uVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar1[uVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data + 8) != pdVar3) {
          uVar7 = 1;
          uVar4 = 0;
          do {
            std::ostream::_M_insert<double>(pdVar3[uVar4]);
            pvVar1 = (data->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (((long)*(pointer *)
                        ((long)&pvVar1[uVar4].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data + 8) -
                 *(long *)&pvVar1[uVar4].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data >> 3) - 1U != uVar4) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
            }
            uVar4 = (ulong)uVar7;
            pvVar1 = (data->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pdVar3 = pvVar1[uVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar7 = uVar7 + 1;
          } while (uVar4 < (ulong)((long)*(pointer *)
                                          ((long)&pvVar1[uVar6].
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                   (long)pdVar3 >> 3));
        }
        cVar2 = (char)(ostream *)&local_230;
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
        uVar6 = (ulong)((int)uVar6 + 1);
        uVar4 = ((long)(data->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(data->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
    }
    std::ofstream::close();
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"file \"",6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(file_name->_M_dataplus)._M_p,
                      file_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" not found",0xb);
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(1);
}

Assistant:

void save(std::vector<std::vector<T> > const& data, std::string file_name) {
        std::ofstream file;
        file.open(file_name.c_str());
        if(!file.is_open())
        {
            std::cout << "file \"" << file_name << "\" not found" << std::endl;
            exit(1);
        }

        file.precision(std::numeric_limits<T>::digits10 + 1);
        for(unsigned int i = 0; i < data.size(); i++)
        {
            for(unsigned int j = 0; j < data[i].size(); j++)
            {
                file << data[i][j];
                if (j != data[j].size() - 1)
                    file << " ";
            }
            file << std::endl;
        }
        file.close();
    }